

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMAddressingModes.h
# Opt level: O0

uint64_t ARM_AM_decodeNEONModImm(uint ModImm,uint *EltBits)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint local_2c;
  ulong uStack_28;
  uint ByteNum;
  uint64_t Val;
  uint Imm8;
  uint OpCmode;
  uint *EltBits_local;
  uint ModImm_local;
  
  uVar2 = getNEONModImmOpCmode(ModImm);
  uVar3 = getNEONModImmVal(ModImm);
  uStack_28 = 0;
  if (uVar2 == 0xe) {
    uStack_28 = (ulong)uVar3;
    *EltBits = 8;
  }
  else if ((uVar2 & 0xc) == 8) {
    uStack_28 = (ulong)uVar3 << (sbyte)(((uVar2 & 6) >> 1) << 3);
    *EltBits = 0x10;
  }
  else if ((uVar2 & 8) == 0) {
    uStack_28 = (ulong)uVar3 << (sbyte)(((uVar2 & 6) >> 1) << 3);
    *EltBits = 0x20;
  }
  else if ((uVar2 & 0xe) == 0xc) {
    cVar1 = ((byte)uVar2 & 1) + 1;
    uStack_28 = (ulong)(uVar3 << cVar1 * '\b' | 0xffff >> (('\x02' - cVar1) * '\b' & 0x1fU));
    *EltBits = 0x20;
  }
  else if (uVar2 == 0x1e) {
    for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
      if ((ModImm >> ((byte)local_2c & 0x1f) & 1) != 0) {
        uStack_28 = 0xffL << ((byte)(local_2c << 3) & 0x3f) | uStack_28;
      }
    }
    *EltBits = 0x40;
  }
  return uStack_28;
}

Assistant:

static inline uint64_t ARM_AM_decodeNEONModImm(unsigned ModImm, unsigned *EltBits)
{
	unsigned OpCmode = getNEONModImmOpCmode(ModImm);
	unsigned Imm8 = getNEONModImmVal(ModImm);
	uint64_t Val = 0;
	unsigned ByteNum;

	if (OpCmode == 0xe) {
		// 8-bit vector elements
		Val = Imm8;
		*EltBits = 8;
	} else if ((OpCmode & 0xc) == 0x8) {
		// 16-bit vector elements
		ByteNum = (OpCmode & 0x6) >> 1;
		Val = (uint64_t)Imm8 << (8 * ByteNum);
		*EltBits = 16;
	} else if ((OpCmode & 0x8) == 0) {
		// 32-bit vector elements, zero with one byte set
		ByteNum = (OpCmode & 0x6) >> 1;
		Val = (uint64_t)Imm8 << (8 * ByteNum);
		*EltBits = 32;
	} else if ((OpCmode & 0xe) == 0xc) {
		// 32-bit vector elements, one byte with low bits set
		ByteNum = 1 + (OpCmode & 0x1);
		Val = (Imm8 << (8 * ByteNum)) | (0xffff >> (8 * (2 - ByteNum)));
		*EltBits = 32;
	} else if (OpCmode == 0x1e) {
		// 64-bit vector elements
		for (ByteNum = 0; ByteNum < 8; ++ByteNum) {
			if ((ModImm >> ByteNum) & 1)
				Val |= (uint64_t)0xff << (8 * ByteNum);
		}
		*EltBits = 64;
	} else {
		//llvm_unreachable("Unsupported NEON immediate");
	}
	return Val;
}